

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureSamplerTest::renderResults
          (TextureSamplerTest *this,Surface *textureResult,Surface *samplerResult,int x,int y)

{
  SamplingState *pSVar1;
  RenderContext *pRVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  SamplingState state;
  SamplingState state_00;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  GLenum GVar17;
  undefined4 extraout_var;
  TestError *this_00;
  void *pvVar18;
  GLuint sampler;
  GLuint texture;
  GLuint local_94;
  GLuint local_90;
  int local_8c;
  TextureFormat local_88;
  Surface *local_80;
  undefined8 uStack_78;
  undefined4 uStack_70;
  undefined4 local_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  PixelBufferAccess local_58;
  Functions *gl;
  
  local_80 = textureResult;
  iVar16 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar16);
  local_90 = createTexture(gl,this->m_target);
  local_94 = 0xffffffff;
  local_8c = y;
  (*gl->viewport)(x,y,0x80,0x80);
  GVar17 = (*gl->getError)();
  glu::checkError(GVar17,"glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x205);
  (*gl->genSamplers)(1,&local_94);
  GVar17 = (*gl->getError)();
  glu::checkError(GVar17,"glGenSamplers(1, &sampler)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x208);
  if (local_94 != 0xffffffff) {
    (*gl->bindSampler)(0,local_94);
    GVar17 = (*gl->getError)();
    glu::checkError(GVar17,"glBindSampler(0, sampler)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x20c);
    uVar3 = (this->m_samplerState).wrapS;
    uVar10 = (this->m_samplerState).minFilter;
    uVar11 = (this->m_samplerState).magFilter;
    uVar12 = (this->m_samplerState).wrapT;
    state.wrapT = uVar12;
    state.magFilter = uVar11;
    state.minFilter = uVar10;
    uVar4 = (this->m_samplerState).wrapR;
    uVar5 = (this->m_samplerState).minLod;
    uVar6 = (this->m_samplerState).maxLod;
    state.maxLod = (GLfloat)uVar6;
    state.minLod = (GLfloat)uVar5;
    state.wrapS = uVar3;
    state.wrapR = uVar4;
    setSamplerState(gl,state,local_94);
    (*gl->bindTexture)(this->m_target,local_90);
    GVar17 = (*gl->getError)();
    glu::checkError(GVar17,"glBindTexture(m_target, texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x213);
    uVar7 = (this->m_textureState).wrapR;
    uStack_64._0_4_ = (this->m_textureState).minLod;
    uStack_64._4_4_ = (this->m_textureState).maxLod;
    pSVar1 = &this->m_textureState;
    uStack_78._0_4_ = pSVar1->minFilter;
    uStack_78._4_4_ = pSVar1->magFilter;
    uVar8 = (this->m_textureState).wrapT;
    uVar9 = (this->m_textureState).wrapS;
    uVar13 = pSVar1->minFilter;
    uVar14 = pSVar1->magFilter;
    uVar15 = pSVar1->wrapT;
    state_00.wrapT = uVar15;
    state_00.magFilter = uVar14;
    state_00.minFilter = uVar13;
    state_00.wrapS = uVar9;
    state_00.wrapR = uVar7;
    state_00.minLod = (GLfloat)(undefined4)uStack_64;
    state_00.maxLod = (GLfloat)uStack_64._4_4_;
    uStack_70 = uVar8;
    local_6c = uVar9;
    uStack_68 = uVar7;
    setTextureState(gl,this->m_target,state_00);
    render(this);
    pRVar2 = this->m_renderCtx;
    local_88.order = RGBA;
    local_88.type = UNORM_INT8;
    pvVar18 = (void *)(samplerResult->m_pixels).m_cap;
    if (pvVar18 != (void *)0x0) {
      pvVar18 = (samplerResult->m_pixels).m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,&local_88,samplerResult->m_width,samplerResult->m_height,1,pvVar18);
    iVar16 = local_8c;
    glu::readPixels(pRVar2,x,local_8c,&local_58);
    (*gl->bindSampler)(0,0);
    GVar17 = (*gl->getError)();
    glu::checkError(GVar17,"glBindSampler(0, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x21d);
    render(this);
    pRVar2 = this->m_renderCtx;
    local_88.order = RGBA;
    local_88.type = UNORM_INT8;
    pvVar18 = (void *)(local_80->m_pixels).m_cap;
    if (pvVar18 != (void *)0x0) {
      pvVar18 = (local_80->m_pixels).m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,&local_88,local_80->m_width,local_80->m_height,1,pvVar18);
    glu::readPixels(pRVar2,x,iVar16,&local_58);
    (*gl->deleteSamplers)(1,&local_94);
    GVar17 = (*gl->getError)();
    glu::checkError(GVar17,"glDeleteSamplers(1, &sampler)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x223);
    (*gl->deleteTextures)(1,&local_90);
    GVar17 = (*gl->getError)();
    glu::checkError(GVar17,"glDeleteTextures(1, &texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x225);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"sampler != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
             ,0x209);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureSamplerTest::renderResults (tcu::Surface& textureResult, tcu::Surface& samplerResult, int x, int y)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	GLuint					texture	= createTexture(gl, m_target);
	GLuint					sampler	= -1;

	gl.viewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)");

	gl.genSamplers(1, &sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenSamplers(1, &sampler)");
	TCU_CHECK(sampler != (GLuint)-1);

	gl.bindSampler(0, sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(0, sampler)");

	// First set sampler state
	setSamplerState(gl, m_samplerState, sampler);

	// Set texture state
	gl.bindTexture(m_target, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture)");

	setTextureState(gl, m_target, m_textureState);

	// Render using sampler
	render();
	glu::readPixels(m_renderCtx, x, y, samplerResult.getAccess());

	// Render without sampler
	gl.bindSampler(0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(0, 0)");

	render();
	glu::readPixels(m_renderCtx, x, y, textureResult.getAccess());

	gl.deleteSamplers(1, &sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteSamplers(1, &sampler)");
	gl.deleteTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures(1, &texture)");
}